

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3StrAccumAppend(StrAccum *p,char *z,int N)

{
  uint uVar1;
  char *__dest;
  int n;
  long lVar2;
  char *pOld;
  
  if (p->mallocFailed == '\0' && p->tooBig == '\0') {
    if (N < 0) {
      N = sqlite3Strlen30(z);
    }
    if (z != (char *)0x0 && N != 0) {
      uVar1 = p->nChar;
      if (p->nAlloc <= (int)(uVar1 + N)) {
        if (p->useMalloc == '\0') {
          p->tooBig = '\x01';
          N = p->nAlloc + ~uVar1;
          if (N < 1) {
            return;
          }
        }
        else {
          pOld = (char *)0x0;
          if (p->zText != p->zBase) {
            pOld = p->zText;
          }
          lVar2 = (ulong)(uint)N + (long)(int)uVar1 + 1;
          if (p->mxAlloc < lVar2) {
            sqlite3StrAccumReset(p);
            p->tooBig = '\x01';
            return;
          }
          n = (int)lVar2;
          p->nAlloc = n;
          if (p->useMalloc == '\x01') {
            __dest = (char *)sqlite3DbRealloc(p->db,pOld,n);
          }
          else {
            __dest = (char *)sqlite3_realloc(pOld,n);
          }
          if (__dest == (char *)0x0) {
            p->mallocFailed = '\x01';
            sqlite3StrAccumReset(p);
            return;
          }
          uVar1 = p->nChar;
          if (0 < (int)uVar1 && pOld == (char *)0x0) {
            memcpy(__dest,p->zText,(ulong)uVar1);
            uVar1 = p->nChar;
          }
          p->zText = __dest;
        }
      }
      memcpy(p->zText + (int)uVar1,z,(ulong)(uint)N);
      p->nChar = p->nChar + N;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumAppend(StrAccum *p, const char *z, int N){
  assert( z!=0 || N==0 );
  if( p->tooBig | p->mallocFailed ){
    testcase(p->tooBig);
    testcase(p->mallocFailed);
    return;
  }
  assert( p->zText!=0 || p->nChar==0 );
  if( N<0 ){
    N = sqlite3Strlen30(z);
  }
  if( N==0 || NEVER(z==0) ){
    return;
  }
  if( p->nChar+N >= p->nAlloc ){
    char *zNew;
    if( !p->useMalloc ){
      p->tooBig = 1;
      N = p->nAlloc - p->nChar - 1;
      if( N<=0 ){
        return;
      }
    }else{
      char *zOld = (p->zText==p->zBase ? 0 : p->zText);
      i64 szNew = p->nChar;
      szNew += N + 1;
      if( szNew > p->mxAlloc ){
        sqlite3StrAccumReset(p);
        p->tooBig = 1;
        return;
      }else{
        p->nAlloc = (int)szNew;
      }
      if( p->useMalloc==1 ){
        zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
      }else{
        zNew = sqlite3_realloc(zOld, p->nAlloc);
      }
      if( zNew ){
        if( zOld==0 && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
        p->zText = zNew;
      }else{
        p->mallocFailed = 1;
        sqlite3StrAccumReset(p);
        return;
      }
    }
  }
  assert( p->zText );
  memcpy(&p->zText[p->nChar], z, N);
  p->nChar += N;
}